

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall cfdcapi_common_CfdFreeBuffer_Test::TestBody(cfdcapi_common_CfdFreeBuffer_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_1;
  void *buffer;
  AssertionResult gtest_ar;
  int ret;
  int *in_stack_ffffffffffffff60;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  char *in_stack_ffffffffffffff70;
  AssertionResult *this_01;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_64;
  AssertionResult local_60;
  void *local_50;
  AssertHelper local_48;
  Message local_40 [3];
  undefined4 local_24;
  AssertionResult local_20;
  int local_c;
  
  local_c = CfdFreeBuffer((void *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  local_24 = 0;
  this_01 = &local_20;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&this_01->success_,in_stack_ffffffffffffff70,
             (CfdErrorCode *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(local_40);
    in_stack_ffffffffffffff70 =
         testing::AssertionResult::failure_message((AssertionResult *)0x329345);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x57,in_stack_ffffffffffffff70);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)0x329393);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3293d6);
  local_50 = malloc(1);
  local_c = CfdFreeBuffer((void *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  local_64 = 0;
  this_00 = &local_60;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&this_01->success_,in_stack_ffffffffffffff70,
             (CfdErrorCode *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             (int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x329482);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x5b,message);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x3294ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32950e);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdFreeBuffer) {
  int ret = CfdFreeBuffer(NULL);
  EXPECT_EQ(kCfdSuccess, ret);

  void* buffer = malloc(1);
  ret = CfdFreeBuffer(buffer);
  EXPECT_EQ(kCfdSuccess, ret);
}